

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawFlow
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          Iterator it,QList<QTextFrame_*> *floats,QTextBlock *cursorBlockNeedingRepaint)

{
  ulong uVar1;
  undefined1 *puVar2;
  bool bVar3;
  bool bVar4;
  Position PVar5;
  int iVar6;
  PaintContext *pPVar7;
  QTextFrame *pQVar8;
  QCheckPoint *pQVar9;
  const_iterator cVar10;
  QAbstractTextDocumentLayout *this_00;
  qsizetype qVar11;
  QTextObjectInterface *pQVar12;
  long in_RCX;
  QTextFrame *in_RDX;
  QAbstractTextDocumentLayout *in_RSI;
  const_iterator in_RDI;
  QList<QTextFrame_*> *in_R8;
  QTextBlock *in_R9;
  long in_FS_OFFSET;
  bool bVar13;
  QTextObjectInterface *handler;
  int pos;
  QTextFrame *frame;
  int i;
  int currentPosInDoc;
  QTextFrame *c;
  QTextFrame *previousFrame;
  bool inRootFrame;
  QTextDocumentLayout *q;
  QRectF rect;
  const_iterator lastVisibleCheckPoint;
  QTextCharFormat format;
  PaintContext pc;
  QTextBlock previousBlock;
  PaintContext *in_stack_fffffffffffffe08;
  PaintContext *in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  byte bVar14;
  QTextBlock *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe2c;
  byte in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  QAbstractTextDocumentLayout *in_stack_fffffffffffffe30;
  QTextFrame *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int local_184;
  int local_174;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  int local_ec;
  QCheckPoint *local_e8;
  const_iterator local_e0;
  undefined1 local_d8 [7];
  QTextBlock *in_stack_ffffffffffffff30;
  PaintContext *in_stack_ffffffffffffff38;
  QPainter *in_stack_ffffffffffffff40;
  QTextDocumentPrivate *in_stack_ffffffffffffff48;
  QTextDocumentLayoutPrivate *in_stack_ffffffffffffff50;
  undefined1 local_78 [16];
  QTextFrame *in_stack_ffffffffffffff98;
  PaintContext *in_stack_ffffffffffffffa0;
  QPainter *in_stack_ffffffffffffffa8;
  QPointF *in_stack_ffffffffffffffb0;
  QTextDocumentLayoutPrivate *in_stack_ffffffffffffffb8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar7 = (PaintContext *)q_func((QTextDocumentLayoutPrivate *)in_RDI.i);
  bVar3 = QTextFrame::iterator::atEnd((iterator *)&stack0x00000008);
  bVar13 = false;
  if (!bVar3) {
    pQVar8 = QTextFrame::iterator::parentFrame((iterator *)&stack0x00000008);
    bVar13 = false;
    if (pQVar8 != (QTextFrame *)0x0) {
      QTextFrame::iterator::parentFrame((iterator *)&stack0x00000008);
      pQVar8 = QTextFrame::parentFrame((QTextFrame *)in_stack_fffffffffffffe10);
      bVar13 = pQVar8 == (QTextFrame *)0x0;
    }
  }
  local_e0.i = (QCheckPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_e0 = QList<QCheckPoint>::end((QList<QCheckPoint> *)in_stack_fffffffffffffe10);
  if ((bVar13) && (bVar3 = QRectF::isValid((QRectF *)(in_RCX + 0x18)), bVar3)) {
    QList<QCheckPoint>::begin((QList<QCheckPoint> *)in_stack_fffffffffffffe10);
    QList<QCheckPoint>::end((QList<QCheckPoint> *)in_stack_fffffffffffffe10);
    QRectF::bottom((QRectF *)(in_RCX + 0x18));
    local_ec = (int)QFixed::fromReal((qreal)in_stack_fffffffffffffe08);
    cVar10.i._4_4_ = in_stack_fffffffffffffe44;
    cVar10.i._0_4_ = in_stack_fffffffffffffe40;
    local_e8 = (QCheckPoint *)
               std::lower_bound<QList<QCheckPoint>::const_iterator,QFixed>
                         (in_RDI,cVar10,(QFixed *)in_stack_fffffffffffffe20);
    local_e0 = (const_iterator)local_e8;
  }
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::QTextBlock((QTextBlock *)local_18);
  while (bVar3 = QTextFrame::iterator::atEnd((iterator *)&stack0x00000008),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    pQVar8 = QTextFrame::iterator::currentFrame((iterator *)&stack0x00000008);
    if ((bVar13) && (bVar3 = QList<QCheckPoint>::isEmpty((QList<QCheckPoint> *)0x7fd2ae), !bVar3)) {
      if (pQVar8 == (QTextFrame *)0x0) {
        QTextFrame::iterator::currentBlock
                  ((iterator *)
                   CONCAT17(in_stack_fffffffffffffe1f,
                            CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
        local_174 = QTextBlock::position((QTextBlock *)in_stack_fffffffffffffe08);
      }
      else {
        local_174 = QTextFrame::firstPosition((QTextFrame *)in_stack_fffffffffffffe08);
      }
      in_stack_fffffffffffffe44 = local_174;
      pQVar9 = QList<QCheckPoint>::constLast((QList<QCheckPoint> *)in_stack_fffffffffffffe08);
      if (pQVar9->positionInFrame <= in_stack_fffffffffffffe44) break;
      cVar10 = QList<QCheckPoint>::end((QList<QCheckPoint> *)in_stack_fffffffffffffe10);
      bVar3 = QList<QCheckPoint>::const_iterator::operator!=(&local_e0,cVar10);
      if (((bVar3) && (bVar3 = QRectF::isValid((QRectF *)(in_RCX + 0x18)), bVar3)) &&
         (pQVar9 = QList<QCheckPoint>::const_iterator::operator->(&local_e0),
         in_stack_fffffffffffffe40 = local_174, pQVar9->positionInFrame <= local_174)) break;
    }
    if (pQVar8 == (QTextFrame *)0x0) {
      memcpy(local_78,&DAT_00bd2120,0x50);
      QAbstractTextDocumentLayout::PaintContext::PaintContext
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      QTextFrame::iterator::currentBlock
                ((iterator *)
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
      bVar3 = isEmptyBlockAfterTable
                        ((QTextBlock *)in_stack_fffffffffffffe10,
                         (QTextFrame *)in_stack_fffffffffffffe08);
      if (bVar3) {
        QList<QAbstractTextDocumentLayout::Selection>::clear
                  ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffffe10);
      }
      in_stack_fffffffffffffe30 = in_RSI;
      in_stack_fffffffffffffe38 = in_RDX;
      QTextFrame::iterator::currentBlock
                ((iterator *)
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
      puVar2 = _local_d8;
      uVar1 = (ulong)_local_d8 >> 0x38;
      drawBlock(in_stack_ffffffffffffff50,(QPointF *)in_stack_ffffffffffffff48,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                SUB81(uVar1,0));
      _local_d8 = puVar2;
      QAbstractTextDocumentLayout::PaintContext::~PaintContext(in_stack_fffffffffffffe10);
    }
    else {
      drawFrame(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    QTextBlock::blockFormat(in_stack_fffffffffffffe20);
    bVar4 = isEmptyBlockBeforeTable
                      (in_stack_fffffffffffffe20,
                       (QTextBlockFormat *)
                       CONCAT17(in_stack_fffffffffffffe1f,
                                CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)),
                       (Iterator *)in_stack_fffffffffffffe10);
    bVar3 = false;
    if (bVar4) {
      bVar3 = QTextBlock::contains
                        ((QTextBlock *)
                         (ulong)CONCAT16(in_stack_fffffffffffffe2e,
                                         CONCAT24(in_stack_fffffffffffffe2c,
                                                  in_stack_fffffffffffffe28)),
                         (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    }
    in_stack_fffffffffffffe2e = bVar3;
    in_stack_fffffffffffffe2f = in_stack_fffffffffffffe2e;
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7fd523);
    if ((in_stack_fffffffffffffe2e & 1) != 0) {
      QTextBlock::operator=(in_R9,(QTextBlock *)local_18);
    }
    QTextFrame::iterator::currentBlock
              ((iterator *)
               CONCAT17(in_stack_fffffffffffffe1f,
                        CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
    QTextBlock::operator=((QTextBlock *)local_18,(QTextBlock *)&stack0xffffffffffffff48);
    QTextFrame::iterator::operator++((iterator *)in_RDI.i);
  }
  local_184 = 0;
  while( true ) {
    this_00 = (QAbstractTextDocumentLayout *)(long)local_184;
    qVar11 = QList<QTextFrame_*>::size(in_R8);
    if (qVar11 <= (long)this_00) break;
    QList<QTextFrame_*>::at
              ((QList<QTextFrame_*> *)in_stack_fffffffffffffe10,(qsizetype)in_stack_fffffffffffffe08
              );
    bVar13 = isFrameFromInlineObject((QTextFrame *)in_stack_fffffffffffffe10);
    bVar14 = 1;
    if (bVar13) {
      QTextFrame::frameFormat((QTextFrame *)this_00);
      PVar5 = QTextFrameFormat::position((QTextFrameFormat *)0x7fd614);
      bVar14 = PVar5 == InFlow;
      QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7fd63c);
    }
    if ((bVar14 & 1) == 0) {
      iVar6 = QTextFrame::firstPosition((QTextFrame *)in_stack_fffffffffffffe08);
      _local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractTextDocumentLayout::format
                (in_stack_fffffffffffffe30,
                 CONCAT13(in_stack_fffffffffffffe2f,
                          CONCAT12(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe2c)));
      in_stack_fffffffffffffe10 = pPVar7;
      QTextFormat::objectType((QTextFormat *)0x7fd6ad);
      pQVar12 = QAbstractTextDocumentLayout::handlerForObject
                          (this_00,(int)((ulong)in_RDI.i >> 0x20));
      if (pQVar12 != (QTextObjectInterface *)0x0) {
        local_110 = 0xffffffffffffffff;
        local_108 = 0xffffffffffffffff;
        local_100 = 0xffffffffffffffff;
        local_f8 = 0xffffffffffffffff;
        frameBoundingRectInternal
                  ((QTextDocumentLayoutPrivate *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38);
        (*pQVar12->_vptr_QTextObjectInterface[3])
                  (pQVar12,in_RDX,&local_110,
                   (((QTextDocumentLayoutPrivate *)in_RDI.i)->
                   super_QAbstractTextDocumentLayoutPrivate).document,(ulong)(iVar6 - 1),local_d8);
      }
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7fd75e);
    }
    local_184 = local_184 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawFlow(const QPointF &offset, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &context,
                                          QTextFrame::Iterator it, const QList<QTextFrame *> &floats, QTextBlock *cursorBlockNeedingRepaint) const
{
    Q_Q(const QTextDocumentLayout);
    const bool inRootFrame = (!it.atEnd() && it.parentFrame() && it.parentFrame()->parentFrame() == nullptr);

    auto lastVisibleCheckPoint = checkPoints.end();
    if (inRootFrame && context.clip.isValid()) {
        lastVisibleCheckPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), QFixed::fromReal(context.clip.bottom()));
    }

    QTextBlock previousBlock;
    QTextFrame *previousFrame = nullptr;

    for (; !it.atEnd(); ++it) {
        QTextFrame *c = it.currentFrame();

        if (inRootFrame && !checkPoints.isEmpty()) {
            int currentPosInDoc;
            if (c)
                currentPosInDoc = c->firstPosition();
            else
                currentPosInDoc = it.currentBlock().position();

            // if we're past what is already laid out then we're better off
            // not trying to draw things that may not be positioned correctly yet
            if (currentPosInDoc >= checkPoints.constLast().positionInFrame)
                break;

            if (lastVisibleCheckPoint != checkPoints.end()
                && context.clip.isValid()
                && currentPosInDoc >= lastVisibleCheckPoint->positionInFrame
               )
                break;
        }

        if (c)
            drawFrame(offset, painter, context, c);
        else {
            QAbstractTextDocumentLayout::PaintContext pc = context;
            if (isEmptyBlockAfterTable(it.currentBlock(), previousFrame))
                pc.selections.clear();
            drawBlock(offset, painter, pc, it.currentBlock(), inRootFrame);
        }

        // when entering a table and the previous block is empty
        // then layoutFlow 'hides' the block that just causes a
        // new line by positioning it /on/ the table border. as we
        // draw that block before the table itself the decoration
        // 'overpaints' the cursor and we need to paint it afterwards
        // again
        if (isEmptyBlockBeforeTable(previousBlock, previousBlock.blockFormat(), it)
            && previousBlock.contains(context.cursorPosition)
           ) {
            *cursorBlockNeedingRepaint = previousBlock;
        }

        previousBlock = it.currentBlock();
        previousFrame = c;
    }

    for (int i = 0; i < floats.size(); ++i) {
        QTextFrame *frame = floats.at(i);
        if (!isFrameFromInlineObject(frame)
            || frame->frameFormat().position() == QTextFrameFormat::InFlow)
            continue;

        const int pos = frame->firstPosition() - 1;
        QTextCharFormat format = const_cast<QTextDocumentLayout *>(q)->format(pos);
        QTextObjectInterface *handler = q->handlerForObject(format.objectType());
        if (handler) {
            QRectF rect = frameBoundingRectInternal(frame);
            handler->drawObject(painter, rect, document, pos, format);
        }
    }
}